

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O1

bool __thiscall Reducer::writeAndTestReduction(Reducer *this,ProgramResult *out)

{
  size_type *psVar1;
  Module *pMVar2;
  pointer pcVar3;
  bool bVar4;
  undefined1 local_e8 [8];
  ModuleWriter writer;
  long local_60 [2];
  string local_50;
  
  writer._0_8_ = &this->toolOptions->passOptions;
  writer._16_8_ = &writer.symbolMap._M_string_length;
  writer.symbolMap._M_dataplus._M_p = (pointer)0x0;
  writer.symbolMap._M_string_length._0_1_ = 0;
  writer.symbolMap.field_2._8_8_ = &writer.sourceMapFilename._M_string_length;
  writer.sourceMapFilename._M_dataplus._M_p = (pointer)0x0;
  writer.sourceMapFilename._M_string_length._0_1_ = 0;
  psVar1 = &writer.sourceMapUrl._M_string_length;
  writer.sourceMapUrl._M_dataplus._M_p = (pointer)0x0;
  writer.sourceMapUrl._M_string_length._0_1_ = 0;
  writer.options._1_1_ = 0;
  writer.options._0_1_ = this->binary;
  local_e8[0] = this->debugInfo;
  pMVar2 = (this->
           super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
           ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
           super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.currModule;
  pcVar3 = (this->test)._M_dataplus._M_p;
  writer.sourceMapFilename.field_2._8_8_ = psVar1;
  writer.sourceMapUrl.field_2._8_8_ = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)&writer.sourceMapUrl.field_2 + 8),pcVar3,
             pcVar3 + (this->test)._M_string_length);
  wasm::ModuleWriter::write(local_e8,pMVar2,(undefined1 *)((long)&writer.sourceMapUrl.field_2 + 8));
  if ((long *)writer.sourceMapUrl.field_2._8_8_ != local_60) {
    operator_delete((void *)writer.sourceMapUrl.field_2._8_8_,local_60[0] + 1);
  }
  pcVar3 = (this->command)._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar3,pcVar3 + (this->command)._M_string_length);
  ProgramResult::getFromExecution(out,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  bVar4 = ProgramResult::operator==(out,&expected);
  if ((size_type *)writer.sourceMapFilename.field_2._8_8_ != psVar1) {
    operator_delete((void *)writer.sourceMapFilename.field_2._8_8_,
                    CONCAT71(writer.sourceMapUrl._M_string_length._1_7_,
                             (undefined1)writer.sourceMapUrl._M_string_length) + 1);
  }
  if ((size_type *)writer.symbolMap.field_2._8_8_ != &writer.sourceMapFilename._M_string_length) {
    operator_delete((void *)writer.symbolMap.field_2._8_8_,
                    CONCAT71(writer.sourceMapFilename._M_string_length._1_7_,
                             (undefined1)writer.sourceMapFilename._M_string_length) + 1);
  }
  if ((size_type *)writer._16_8_ != &writer.symbolMap._M_string_length) {
    operator_delete((void *)writer._16_8_,
                    CONCAT71(writer.symbolMap._M_string_length._1_7_,
                             (undefined1)writer.symbolMap._M_string_length) + 1);
  }
  return bVar4;
}

Assistant:

bool writeAndTestReduction(ProgramResult& out) {
    // write the module out
    ModuleWriter writer(toolOptions.passOptions);
    writer.setBinary(binary);
    writer.setDebugInfo(debugInfo);
    writer.write(*getModule(), test);
    // note that it is ok for the destructively-reduced module to be bigger
    // than the previous - each destructive reduction removes logical code,
    // and so is strictly better, even if the wasm binary format happens to
    // encode things slightly less efficiently.
    // test it
    out.getFromExecution(command);
    return out == expected;
  }